

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O3

void re2c::output_state_goto(ostream *o,uint32_t ind,uint32_t start_label)

{
  opt_t *poVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  string str;
  char *local_78;
  long local_70;
  char local_68;
  undefined7 uStack_67;
  ostream *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  iVar3 = ind + 1;
  local_58 = o;
  while( true ) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if ((poVar1->target == DOT) || (iVar3 = iVar3 + -1, iVar3 == 0)) break;
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)(poVar1->indString)._M_dataplus._M_p);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_58,local_78,local_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"switch (",8);
  output_get_state_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") {\n",4);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (poVar1->bUseStateAbort == true) {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = '\0';
    iVar3 = ind + 1;
    while( true ) {
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if ((poVar1->target == DOT) || (iVar3 = iVar3 + -1, iVar3 == 0)) break;
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)(poVar1->indString)._M_dataplus._M_p)
      ;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_58,local_78,local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"default: abort();\n",0x12);
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    local_78 = &local_68;
    local_70 = 0;
    local_68 = '\0';
    iVar3 = ind + 1;
    while( true ) {
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if ((poVar1->target == DOT) || (iVar3 = iVar3 + -1, iVar3 == 0)) break;
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)(poVar1->indString)._M_dataplus._M_p)
      ;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_58,local_78,local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"case -1: goto ",0xe);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(poVar1->labelPrefix)._M_dataplus._M_p,
                        (poVar1->labelPrefix)._M_string_length);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
  }
  else {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = '\0';
    iVar3 = ind + 1;
    while( true ) {
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if ((poVar1->target == DOT) || (iVar3 = iVar3 + -1, iVar3 == 0)) break;
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)(poVar1->indString)._M_dataplus._M_p)
      ;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_58,local_78,local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"default: goto ",0xe);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(poVar1->labelPrefix)._M_dataplus._M_p,
                        (poVar1->labelPrefix)._M_string_length);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (last_fill_index != 0) {
    uVar4 = 0;
    do {
      local_78 = &local_68;
      local_70 = 0;
      local_68 = '\0';
      iVar3 = ind + 1;
      while( true ) {
        poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        if ((poVar1->target == DOT) || (iVar3 = iVar3 + -1, iVar3 == 0)) break;
        poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        std::__cxx11::string::_M_append
                  ((char *)&local_78,(ulong)(poVar1->indString)._M_dataplus._M_p);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_58,local_78,local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"case ",5);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": goto ",7);
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(poVar1->yyfilllabel)._M_dataplus._M_p,
                          (poVar1->yyfilllabel)._M_string_length);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < last_fill_index);
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  iVar3 = ind + 1;
  while( true ) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if ((poVar1->target == DOT) || (iVar3 = iVar3 + -1, iVar3 == 0)) break;
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)(poVar1->indString)._M_dataplus._M_p);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_58,local_78,local_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (poVar1->bUseStateNext == true) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_58,(poVar1->yynext)._M_dataplus._M_p,(poVar1->yynext)._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
  }
  return;
}

Assistant:

void output_state_goto (std::ostream & o, uint32_t ind, uint32_t start_label)
{
	o << indent(ind) << "switch (" << output_get_state() << ") {\n";
	if (opts->bUseStateAbort)
	{
		o << indent(ind) << "default: abort();\n";
		o << indent(ind) << "case -1: goto " << opts->labelPrefix << start_label << ";\n";
	}
	else
	{
		o << indent(ind) << "default: goto " << opts->labelPrefix << start_label << ";\n";
	}
	for (uint32_t i = 0; i < last_fill_index; ++i)
	{
		o << indent(ind) << "case " << i << ": goto " << opts->yyfilllabel << i << ";\n";
	}
	o << indent(ind) << "}\n";
	if (opts->bUseStateNext)
	{
		o << opts->yynext << ":\n";
	}
}